

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O2

void __thiscall QTest::WatchDog::setExpectation(WatchDog *this,Expectation e)

{
  std::mutex::lock(&this->mutex);
  (this->expecting)._M_i =
       (this->expecting)._M_i + (ulong)(e == TestFunctionStart) * 4 & ~ThreadEnd | e;
  std::condition_variable::notify_all();
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void setExpectation(Expectation e)
    {
        Q_ASSERT(generation(e) == 0); // no embedded generation allowed
        const auto locker = qt_scoped_lock(mutex);
        auto cur = expecting.load(std::memory_order_relaxed);
        auto gen = generation(cur);
        if (e == TestFunctionStart)
            ++gen;
        e = combine(e, gen);
        expecting.store(e, std::memory_order_relaxed);
        waitCondition.notify_all();
    }